

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_normal.cpp
# Opt level: O2

MPP_RET check_task_wait(MppDecImpl *dec,DecTask *task)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  MPP_RET MVar4;
  MPP_RET MVar5;
  char *pcVar6;
  RK_U32 RVar7;
  
  uVar1 = dec->parser_notify_flag;
  uVar2 = (task->wait).val;
  MVar5 = MPP_OK;
  bVar3 = true;
  pcVar6 = "work";
  MVar4 = MPP_OK;
  if (dec->reset_flag == 0) {
    if ((uVar1 >> 0x10 & 1) != 0) {
      RVar7 = uVar1 & 0xfffeffff;
      goto LAB_00146bcb;
    }
    RVar7 = 0;
    if ((uVar2 & uVar1) != 0 || uVar2 == 0) goto LAB_00146bcb;
    bVar3 = false;
    pcVar6 = "wait";
    MVar4 = MPP_NOK;
  }
  MVar5 = MVar4;
  RVar7 = 0;
LAB_00146bcb:
  if (((byte)mpp_dec_debug & 0x10) != 0) {
    _mpp_log_l(4,"mpp_dec","%p %08x -> %08x [%08x] notify %08x -> %s\n","check_task_wait",dec,
               (ulong)dec->parser_wait_flag,(ulong)uVar2,(ulong)(~uVar2 & dec->parser_wait_flag),
               (ulong)uVar1,pcVar6);
  }
  dec->parser_status_flag = (RK_U32)task->status;
  dec->parser_wait_flag = (RK_U32)task->wait;
  dec->parser_notify_flag = RVar7;
  if (bVar3) {
    dec->parser_work_count = dec->parser_work_count + 1;
  }
  else {
    dec->parser_wait_count = dec->parser_wait_count + 1;
  }
  return MVar5;
}

Assistant:

static MPP_RET check_task_wait(MppDecImpl *dec, DecTask *task)
{
    MPP_RET ret = MPP_OK;
    RK_U32 notify = dec->parser_notify_flag;
    RK_U32 last_wait = dec->parser_wait_flag;
    RK_U32 curr_wait = task->wait.val;
    RK_U32 wait_chg  = last_wait & (~curr_wait);
    RK_U32 keep_notify = 0;

    do {
        if (dec->reset_flag)
            break;

        // NOTE: User control should always be processed
        if (notify & MPP_DEC_CONTROL) {
            keep_notify = notify & (~MPP_DEC_CONTROL);
            break;
        }

        // NOTE: When condition is not fulfilled check nofify flag again
        if (!curr_wait || (curr_wait & notify))
            break;

        // wait for condition
        ret = MPP_NOK;
    } while (0);

    dec_dbg_status("%p %08x -> %08x [%08x] notify %08x -> %s\n", dec,
                   last_wait, curr_wait, wait_chg, notify, (ret) ? ("wait") : ("work"));

    dec->parser_status_flag = task->status.val;
    dec->parser_wait_flag = task->wait.val;
    dec->parser_notify_flag = keep_notify;

    if (ret) {
        dec->parser_wait_count++;
    } else {
        dec->parser_work_count++;
    }

    return ret;
}